

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O1

void __thiscall leveldb::RecoveryTest::RemoveManifestFile(RecoveryTest *this)

{
  Env *pEVar1;
  char *message;
  AssertionResult gtest_ar;
  char local_51;
  AssertHelper local_50;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> local_48 [8];
  undefined8 *local_40;
  string local_38;
  
  pEVar1 = this->env_;
  ManifestFileName_abi_cxx11_(&local_38,this);
  (*pEVar1->_vptr_Env[8])(&local_50,pEVar1,&local_38);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            (local_48,&local_51,(Status *)"env_->RemoveFile(ManifestFileName())");
  if (local_50.data_ != (AssertHelperData *)0x0) {
    operator_delete__(local_50.data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_48[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
               ,0x6e,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  if (local_40 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_40 != local_40 + 2) {
      operator_delete((undefined8 *)*local_40);
    }
    operator_delete(local_40);
  }
  return;
}

Assistant:

void RemoveManifestFile() {
    ASSERT_LEVELDB_OK(env_->RemoveFile(ManifestFileName()));
  }